

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderPackingFunctionTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles31::Functional::PackSnorm4x8Case::iterate(PackSnorm4x8Case *this)

{
  ShaderExecutor *pSVar1;
  deUint32 dVar2;
  int iVar3;
  ulong uVar4;
  char *description;
  int iVar5;
  ulong uVar6;
  int iVar7;
  Hex<8UL> hex;
  Hex<8UL> hex_00;
  long lVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  uint uVar20;
  int iVar21;
  uint uVar25;
  uint uVar27;
  undefined1 auVar22 [16];
  int iVar26;
  int iVar28;
  uint uVar29;
  int iVar30;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar31 [16];
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> inputs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputs;
  void *out;
  int aiStack_1e0 [2];
  int local_1d8;
  int iStack_1d4;
  int iStack_1d0;
  int iStack_1cc;
  Random rnd;
  void *in;
  _func_int **app_Stack_1b0 [48];
  
  dVar2 = deStringHash((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar2 ^ 0x42f2c0);
  inputs.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  inputs.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  inputs.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar3 = 1;
  if (1 < this->m_precision - PRECISION_MEDIUMP) {
    iVar3 = (uint)(this->m_precision == PRECISION_LOWP) * 2;
  }
  in._0_4_ = 0.0;
  in._4_4_ = 0.0;
  app_Stack_1b0[0]._0_4_ = 0.0;
  app_Stack_1b0[0]._4_4_ = 0.0;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&inputs,
             (Vector<float,_4> *)&in);
  in = (void *)0x3f800000bf800000;
  app_Stack_1b0[0] = (_func_int **)0x3f800000bf800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&inputs,
             (Vector<float,_4> *)&in);
  in = (void *)0xbf0000003f000000;
  app_Stack_1b0[0] = (_func_int **)0x3f000000bf000000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&inputs,
             (Vector<float,_4> *)&in);
  in = (void *)0x3fc00000bfc00000;
  app_Stack_1b0[0] = (_func_int **)0x3fc00000bfc00000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&inputs,
             (Vector<float,_4> *)&in);
  app_Stack_1b0[0]._0_4_ = -0.25;
  app_Stack_1b0[0]._4_4_ = 0.75;
  in = (void *)0xbf4000003e800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&inputs,
             (Vector<float,_4> *)&in);
  iVar5 = 0xf;
  while (bVar9 = iVar5 != 0, iVar5 = iVar5 + -1, bVar9) {
    fVar15 = deRandom_getFloat(&rnd.m_rnd);
    fVar16 = deRandom_getFloat(&rnd.m_rnd);
    fVar17 = deRandom_getFloat(&rnd.m_rnd);
    fVar18 = deRandom_getFloat(&rnd.m_rnd);
    app_Stack_1b0[0]._4_4_ = fVar18 * 2.5 + -1.25;
    app_Stack_1b0[0]._0_4_ = fVar17 * 2.5 + -1.25;
    in = (void *)CONCAT44(fVar16 * 2.5 + -1.25,fVar15 * 2.5 + -1.25);
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&inputs,
               (Vector<float,_4> *)&in);
  }
  iVar5 = 0x50;
  while (bVar9 = iVar5 != 0, iVar5 = iVar5 + -1, bVar9) {
    fVar15 = deRandom_getFloat(&rnd.m_rnd);
    fVar16 = deRandom_getFloat(&rnd.m_rnd);
    fVar17 = deRandom_getFloat(&rnd.m_rnd);
    fVar18 = deRandom_getFloat(&rnd.m_rnd);
    app_Stack_1b0[0]._4_4_ = fVar18 * 1e+06 + -500000.0;
    app_Stack_1b0[0]._0_4_ = fVar17 * 1e+06 + -500000.0;
    in = (void *)CONCAT44(fVar16 * 1e+06 + -500000.0,fVar15 * 1e+06 + -500000.0);
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&inputs,
               (Vector<float,_4> *)&in);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&outputs,(long)inputs.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)inputs.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4);
  in = ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)app_Stack_1b0);
  std::operator<<((ostream *)app_Stack_1b0,"Executing shader for ");
  std::ostream::_M_insert<unsigned_long>((ulong)app_Stack_1b0);
  std::operator<<((ostream *)app_Stack_1b0," input values");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)app_Stack_1b0);
  in = inputs.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  out = outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start;
  (*((this->super_ShaderPackingFunctionCase).m_executor)->_vptr_ShaderExecutor[5])();
  pSVar1 = (this->super_ShaderPackingFunctionCase).m_executor;
  (*pSVar1->_vptr_ShaderExecutor[6])
            (pSVar1,(ulong)((long)inputs.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)inputs.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4,&in,&out);
  uVar4 = (ulong)((long)inputs.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)inputs.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 4;
  lVar8 = 0;
  iVar5 = (int)uVar4;
  uVar6 = 0;
  if (0 < iVar5) {
    uVar6 = uVar4 & 0xffffffff;
  }
  uVar4 = 0;
  iVar7 = 0;
  iVar32 = iVar3;
  iVar33 = iVar3;
  iVar34 = iVar3;
  iVar35 = iVar3;
  local_1d8 = iVar3;
  iStack_1d4 = iVar3;
  iStack_1d0 = iVar3;
  iStack_1cc = iVar3;
  while( true ) {
    if (uVar6 == uVar4) break;
    auVar19 = *(undefined1 (*) [16])
               ((long)(inputs.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar8);
    auVar22._8_4_ = 0x3f800000;
    auVar22._0_8_ = 0x3f8000003f800000;
    auVar22._12_4_ = 0x3f800000;
    auVar22 = minps(auVar22,auVar19);
    uVar10 = -(uint)(auVar19._0_4_ < -1.0);
    uVar11 = -(uint)(auVar19._4_4_ < -1.0);
    uVar12 = -(uint)(auVar19._8_4_ < -1.0);
    uVar13 = -(uint)(auVar19._12_4_ < -1.0);
    fVar15 = (float)(uVar10 & 0xc2fe0000 | ~uVar10 & (uint)(auVar22._0_4_ * 127.0));
    fVar16 = (float)(uVar11 & 0xc2fe0000 | ~uVar11 & (uint)(auVar22._4_4_ * 127.0));
    fVar17 = (float)(uVar12 & 0xc2fe0000 | ~uVar12 & (uint)(auVar22._8_4_ * 127.0));
    fVar18 = (float)(uVar13 & 0xc2fe0000 | ~uVar13 & (uint)(auVar22._12_4_ * 127.0));
    uVar11 = -(uint)(fVar15 < 0.0);
    uVar12 = -(uint)(fVar16 < 0.0);
    uVar13 = -(uint)(fVar17 < 0.0);
    uVar14 = -(uint)(fVar18 < 0.0);
    uVar10 = outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar4];
    hex_00.value._4_4_ = 0;
    hex_00.value._0_4_ = uVar10;
    uVar11 = (uint)((float)(uVar11 & 0xbf000000 | ~uVar11 & 0x3f000000) + fVar15);
    uVar12 = (uint)((float)(uVar12 & 0xbf000000 | ~uVar12 & 0x3f000000) + fVar16);
    uVar13 = (uint)((float)(uVar13 & 0xbf000000 | ~uVar13 & 0x3f000000) + fVar17);
    uVar14 = (uint)((float)(uVar14 & 0xbf000000 | ~uVar14 & 0x3f000000) + fVar18);
    uVar20 = -(uint)((int)uVar11 < 0x7f);
    uVar25 = -(uint)((int)uVar12 < 0x7f);
    uVar27 = -(uint)((int)uVar13 < 0x7f);
    uVar29 = -(uint)((int)uVar14 < 0x7f);
    uVar11 = ~uVar20 & 0x7f | uVar11 & uVar20;
    uVar12 = ~uVar25 & 0x7f | uVar12 & uVar25;
    uVar13 = ~uVar27 & 0x7f | uVar13 & uVar27;
    uVar27 = ~uVar29 & 0x7f | uVar14 & uVar29;
    uVar14 = -(uint)(-0x80 < (int)uVar11);
    uVar20 = -(uint)(-0x80 < (int)uVar12);
    uVar25 = -(uint)(-0x80 < (int)uVar13);
    uVar39 = -(uint)(-0x80 < (int)uVar27);
    uVar36 = ~uVar20 & 0xffffff80 | uVar12 & uVar20;
    uVar29 = (~uVar14 & 0xffffff80 | uVar11 & uVar14) & 0xff;
    uVar37 = uVar36 & 0xff;
    uVar38 = (~uVar25 & 0xffffff80 | uVar13 & uVar25) & 0xff;
    uVar14 = uVar29 - (uVar10 & 0xff);
    uVar20 = uVar37 - (uVar10 >> 8 & 0xff);
    uVar25 = uVar38 - (uVar10 >> 0x10 & 0xff);
    uVar27 = ((~uVar39 & 0xffffff80 | uVar27 & uVar39) & 0xff) - (uVar10 >> 0x18);
    uVar10 = (int)uVar14 >> 0x1f;
    uVar11 = (int)uVar20 >> 0x1f;
    uVar12 = (int)uVar25 >> 0x1f;
    uVar13 = (int)uVar27 >> 0x1f;
    iVar21 = (uVar14 ^ uVar10) - uVar10;
    iVar26 = (uVar20 ^ uVar11) - uVar11;
    iVar28 = (uVar25 ^ uVar12) - uVar12;
    iVar30 = (uVar27 ^ uVar13) - uVar13;
    auVar19._0_4_ = -(uint)(iVar32 < iVar21);
    auVar19._4_4_ = -(uint)(iVar33 < iVar26);
    auVar19._8_4_ = -(uint)(iVar34 < iVar28);
    auVar19._12_4_ = -(uint)(iVar35 < iVar30);
    auVar23._4_4_ = auVar19._4_4_;
    auVar23._0_4_ = auVar19._4_4_;
    auVar23._8_4_ = auVar19._4_4_;
    auVar23._12_4_ = auVar19._4_4_;
    auVar31._4_4_ = auVar19._12_4_;
    auVar31._0_4_ = auVar19._8_4_;
    auVar31._8_4_ = auVar19._8_4_;
    auVar31._12_4_ = auVar19._12_4_;
    auVar24._4_4_ = auVar19._12_4_;
    auVar24._0_4_ = auVar19._12_4_;
    auVar24._8_4_ = auVar19._12_4_;
    auVar24._12_4_ = auVar19._12_4_;
    if (((auVar24 | auVar19 | auVar31 | auVar23) & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    {
      if (iVar7 < 10) {
        in = ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)app_Stack_1b0);
        std::operator<<((ostream *)app_Stack_1b0,"ERROR: Mismatch in value ");
        std::ostream::operator<<((ostringstream *)app_Stack_1b0,(int)uVar4);
        std::operator<<((ostream *)app_Stack_1b0,", expected packSnorm4x8(");
        tcu::operator<<((ostream *)app_Stack_1b0,
                        (Vector<float,_4> *)
                        ((long)(inputs.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar8));
        std::operator<<((ostream *)app_Stack_1b0,") = ");
        hex.value._4_4_ = 0;
        hex.value._0_4_ = uVar29 | uVar37 << 8 | uVar38 << 0x10 | uVar36 << 0x18;
        tcu::Format::operator<<((ostream *)app_Stack_1b0,hex);
        std::operator<<((ostream *)app_Stack_1b0,", got ");
        tcu::Format::operator<<((ostream *)app_Stack_1b0,hex_00);
        std::operator<<((ostream *)app_Stack_1b0,"\n  diffs = ");
        out = (void *)CONCAT44(iVar26,iVar21);
        aiStack_1e0[1] = iVar30;
        aiStack_1e0[0] = iVar28;
        tcu::operator<<((ostream *)app_Stack_1b0,(Vector<int,_4> *)&out);
        std::operator<<((ostream *)app_Stack_1b0,", max diff = ");
        std::ostream::operator<<((ostringstream *)app_Stack_1b0,iVar3);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)app_Stack_1b0);
        iVar32 = local_1d8;
        iVar33 = iStack_1d4;
        iVar34 = iStack_1d0;
        iVar35 = iStack_1cc;
      }
      else if (iVar7 == 10) {
        in = ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)app_Stack_1b0);
        std::operator<<((ostream *)app_Stack_1b0,"...");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)app_Stack_1b0);
        iVar32 = local_1d8;
        iVar33 = iStack_1d4;
        iVar34 = iStack_1d0;
        iVar35 = iStack_1cc;
      }
      iVar7 = iVar7 + 1;
    }
    uVar4 = uVar4 + 1;
    lVar8 = lVar8 + 0x10;
  }
  in = ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)app_Stack_1b0);
  std::ostream::operator<<((ostringstream *)app_Stack_1b0,iVar5 - iVar7);
  std::operator<<((ostream *)app_Stack_1b0," / ");
  std::ostream::operator<<((ostringstream *)app_Stack_1b0,iVar5);
  std::operator<<((ostream *)app_Stack_1b0," values passed");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)app_Stack_1b0);
  description = "Pass";
  if (iVar7 != 0) {
    description = "Result comparison failed";
  }
  tcu::TestContext::setTestResult
            ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,(uint)(iVar7 != 0),description);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&inputs.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		de::Random					rnd			(deStringHash(getName()) ^ 0x42f2c0);
		std::vector<tcu::Vec4>		inputs;
		std::vector<deUint32>		outputs;
		const int					maxDiff		= m_precision == glu::PRECISION_HIGHP	? 1	:		// Rounding only.
												  m_precision == glu::PRECISION_MEDIUMP	? 1	:		// (2^-10) * (2^7) + 1
												  m_precision == glu::PRECISION_LOWP	? 2	: 0;	// (2^-8) * (2^7) + 1

		// Special values to check.
		inputs.push_back(tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f));
		inputs.push_back(tcu::Vec4(-1.0f, 1.0f, -1.0f, 1.0f));
		inputs.push_back(tcu::Vec4(0.5f, -0.5f, -0.5f, 0.5f));
		inputs.push_back(tcu::Vec4(-1.5f, 1.5f, -1.5f, 1.5f));
		inputs.push_back(tcu::Vec4(0.25f, -0.75f, -0.25f, 0.75f));

		// Random values, mostly in range.
		for (int ndx = 0; ndx < 15; ndx++)
		{
			const float x = rnd.getFloat()*2.5f - 1.25f;
			const float y = rnd.getFloat()*2.5f - 1.25f;
			const float z = rnd.getFloat()*2.5f - 1.25f;
			const float w = rnd.getFloat()*2.5f - 1.25f;
			inputs.push_back(tcu::Vec4(x, y, z, w));
		}

		// Large random values.
		for (int ndx = 0; ndx < 80; ndx++)
		{
			const float x = rnd.getFloat()*1e6f - 0.5e6f;
			const float y = rnd.getFloat()*1e6f - 0.5e6f;
			const float z = rnd.getFloat()*1e6f - 0.5e6f;
			const float w = rnd.getFloat()*1e6f - 0.5e6f;
			inputs.push_back(tcu::Vec4(x, y, z, w));
		}

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->useProgram();
			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < numValues; valNdx++)
			{
				const deUint16	ref0	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].x(), -1.0f, 1.0f) * 127.0f), -(1<<7), (1<<7)-1);
				const deUint16	ref1	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].y(), -1.0f, 1.0f) * 127.0f), -(1<<7), (1<<7)-1);
				const deUint16	ref2	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].z(), -1.0f, 1.0f) * 127.0f), -(1<<7), (1<<7)-1);
				const deUint16	ref3	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].w(), -1.0f, 1.0f) * 127.0f), -(1<<7), (1<<7)-1);
				const deUint32	ref		= (deUint32(ref3) << 24) | (deUint32(ref2) << 16) | (deUint32(ref1) << 8) | deUint32(ref0);
				const deUint32	res		= outputs[valNdx];
				const deUint16	res0	= (deUint8)(res & 0xff);
				const deUint16	res1	= (deUint8)((res >> 8) & 0xff);
				const deUint16	res2	= (deUint8)((res >> 16) & 0xff);
				const deUint16	res3	= (deUint8)((res >> 24) & 0xff);
				const int		diff0	= de::abs((int)ref0 - (int)res0);
				const int		diff1	= de::abs((int)ref1 - (int)res1);
				const int		diff2	= de::abs((int)ref2 - (int)res2);
				const int		diff3	= de::abs((int)ref3 - (int)res3);

				if (diff0 > maxDiff || diff1 > maxDiff || diff2 > maxDiff || diff3 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx
															   << ", expected packSnorm4x8(" << inputs[valNdx] << ") = " << tcu::toHex(ref)
															   << ", got " << tcu::toHex(res)
															   << "\n  diffs = " << tcu::IVec4(diff0, diff1, diff2, diff3) << ", max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									numFailed == 0 ? "Pass"					: "Result comparison failed");
		}

		return STOP;
	}